

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

string * __thiscall
QPDFWriter::getOriginalID1_abi_cxx11_(string *__return_storage_ptr__,QPDFWriter *this)

{
  bool bVar1;
  allocator<char> local_a9;
  undefined4 local_a8;
  allocator<char> local_a1;
  string local_a0 [32];
  QPDFObjectHandle local_80;
  QPDFObjectHandle local_70 [2];
  allocator<char> local_49;
  string local_48;
  undefined1 local_28 [8];
  QPDFObjectHandle trailer;
  QPDFWriter *this_local;
  
  trailer.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this);
  QPDF::getTrailer((QPDF *)local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"/ID",&local_49);
  bVar1 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_a0,"/ID",&local_a1);
    QPDFObjectHandle::getKey(&local_80,(string *)local_28);
    QPDFObjectHandle::getArrayItem(local_70,(int)&local_80);
    QPDFObjectHandle::getStringValue_abi_cxx11_(__return_storage_ptr__,local_70);
    QPDFObjectHandle::~QPDFObjectHandle(local_70);
    QPDFObjectHandle::~QPDFObjectHandle(&local_80);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator(&local_a1);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_a9);
    std::allocator<char>::~allocator(&local_a9);
  }
  local_a8 = 1;
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFWriter::getOriginalID1()
{
    QPDFObjectHandle trailer = m->pdf.getTrailer();
    if (trailer.hasKey("/ID")) {
        return trailer.getKey("/ID").getArrayItem(0).getStringValue();
    } else {
        return "";
    }
}